

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall EventLoop::unregisterSocket(EventLoop *this,int fd)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  iterator __position;
  uint *puVar2;
  int fd_local;
  epoll_event ev;
  undefined8 local_48 [4];
  
  fd_local = fd;
  std::mutex::lock(&this->mMutex);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
               ::find(&(this->mSockets)._M_t,&fd_local);
  if ((_Rb_tree_header *)__position._M_node != &(this->mSockets)._M_t._M_impl.super__Rb_tree_header)
  {
    std::
    _Rb_tree<int,std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>,std::_Select1st<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>,std::_Select1st<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>>
                        *)&this->mSockets,__position);
    ev.data.u64._4_4_ = 0;
    ev._0_8_ = 0;
    iVar1 = epoll_ctl(this->mPollFd,2,fd_local,(epoll_event *)&ev);
    if (iVar1 == -1) {
      puVar2 = (uint *)__errno_location();
      iVar1 = fd_local;
      __stream = _stderr;
      __errnum = *puVar2;
      if (__errnum != 2) {
        Rct::strerror((Rct *)local_48,__errnum);
        fprintf(__stream,"Unable to unregister socket %d: %d (%s)\n",(ulong)(uint)iVar1,
                (ulong)__errnum,local_48[0]);
        std::__cxx11::string::~string((string *)local_48);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return;
}

Assistant:

void EventLoop::unregisterSocket(int fd)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end())
        return;
#ifdef HAVE_KQUEUE
    const int mode = socket->second.first;
#endif
    mSockets.erase(socket);

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    e = epoll_ctl(mPollFd, EPOLL_CTL_DEL, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        ev.flags = EV_DELETE|EV_DISABLE;
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != ENOENT) {
            fprintf(stderr, "Unable to unregister socket %d: %d (%s)\n",
                    fd, errno, Rct::strerror().constData());
        }
    }
}